

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

string * __thiscall
t_js_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  t_program *program;
  long *plVar3;
  undefined8 *puVar4;
  _Alloc_hider *p_Var5;
  ulong *puVar6;
  pointer pptVar7;
  t_js_generator *ptVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  t_js_generator *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  string local_a8;
  _Alloc_hider *local_88;
  t_program *local_80;
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ptVar8 = (t_js_generator *)0x378967;
  std::__cxx11::string::_M_construct<char_const*>();
  if (this->gen_node_ == true) {
    local_68._8_8_ = (this->super_t_oop_generator).super_t_generator.program_;
    pptVar7 = (((t_program *)local_68._8_8_)->includes_).
              super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_58._M_p =
         (pointer)(((t_program *)local_68._8_8_)->includes_).
                  super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if (pptVar7 != (pointer)local_58._M_p) {
      local_68._M_allocated_capacity = (size_type)&__return_storage_ptr__->field_2;
      do {
        program = *pptVar7;
        make_valid_nodeJs_identifier(&local_50,ptVar8,&program->name_);
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,
                                    (ulong)(this->js_const_type_)._M_dataplus._M_p);
        local_88 = &local_78;
        p_Var5 = (_Alloc_hider *)(plVar3 + 2);
        if ((_Alloc_hider *)*plVar3 == p_Var5) {
          local_78._M_p = p_Var5->_M_p;
          sStack_70 = plVar3[3];
        }
        else {
          local_78._M_p = p_Var5->_M_p;
          local_88 = (_Alloc_hider *)*plVar3;
        }
        local_80 = (t_program *)plVar3[1];
        *plVar3 = (long)p_Var5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_d8 = *puVar6;
          lStack_d0 = plVar3[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *puVar6;
          local_e8 = (ulong *)*plVar3;
        }
        local_e0 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        get_import_path_abi_cxx11_(&local_a8,this,program);
        uVar9 = 0xf;
        if (local_e8 != &local_d8) {
          uVar9 = local_d8;
        }
        uVar2 = (long)(_Rb_tree_color *)local_a8._M_string_length + local_e0;
        if (uVar9 < uVar2) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar10 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < uVar2) goto LAB_0028d0a0;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_e8);
        }
        else {
LAB_0028d0a0:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e8,(ulong)local_a8._M_dataplus._M_p);
        }
        puVar1 = puVar4 + 2;
        if ((undefined8 *)*puVar4 == puVar1) {
          local_f8 = *puVar1;
          uStack_f0 = puVar4[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar1;
          local_108 = (undefined8 *)*puVar4;
        }
        local_100 = puVar4[1];
        *puVar4 = puVar1;
        puVar4[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_c8 = (t_js_generator *)local_b8;
        ptVar8 = (t_js_generator *)(plVar3 + 2);
        if ((t_js_generator *)*plVar3 == ptVar8) {
          local_b8._0_8_ = (ptVar8->super_t_oop_generator).super_t_generator._vptr_t_generator;
          local_b8._8_8_ = plVar3[3];
        }
        else {
          local_b8._0_8_ = (ptVar8->super_t_oop_generator).super_t_generator._vptr_t_generator;
          local_c8 = (t_js_generator *)*plVar3;
        }
        local_c0 = plVar3[1];
        *plVar3 = (long)ptVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ptVar8 = local_c8;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8);
        if (local_c8 != (t_js_generator *)local_b8) {
          operator_delete(local_c8);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pptVar7 = pptVar7 + 1;
      } while (pptVar7 != (pointer)local_58._M_p);
      if (*(pointer *)(local_68._8_8_ + 0xc0) !=
          (((vector<t_program_*,_std::allocator<t_program_*>_> *)(local_68._8_8_ + 0xb8))->
          super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::render_includes() {
  string result = "";

  if (gen_node_) {
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      result += js_const_type_ + make_valid_nodeJs_identifier(include->get_name()) + "_ttypes = require('" + get_import_path(include) + "');\n";
    }
    if (includes.size() > 0) {
      result += "\n";
    }
  }

  return result;
}